

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> * __thiscall
cs_impl::
cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
::_call<0>(_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *__return_storage_ptr__,
          cni_helper<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&),_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_(*)(std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&)>
          *this,vector *args,sequence<0> *param_2)

{
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *p_Var1;
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> local_38;
  
  p_Var1 = try_convert_and_check<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_&,_std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mFunc)._M_invoker)(&local_38,(_Any_data *)this,p_Var1);
    __return_storage_ptr__->_M_cur = local_38._M_cur;
    __return_storage_ptr__->_M_first = local_38._M_first;
    __return_storage_ptr__->_M_last = local_38._M_last;
    __return_storage_ptr__->_M_node = local_38._M_node;
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}